

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_insert.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructInsertStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  reference pvVar1;
  idx_t iVar2;
  BaseStatistics *new_stats_00;
  long lVar3;
  pointer pBVar4;
  idx_t i;
  idx_t i_00;
  pointer pBVar5;
  idx_t i_1;
  ulong __n;
  LogicalType *other;
  LogicalType local_a0;
  BaseStatistics new_stats;
  
  this_00 = input->child_stats;
  other = &(input->expr->super_Expression).return_type;
  LogicalType::LogicalType(&local_a0,other);
  StructStats::CreateUnknown(&new_stats,&local_a0);
  LogicalType::~LogicalType(&local_a0);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
  iVar2 = StructType::GetChildCount(&pvVar1->type);
  pvVar1 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
  new_stats_00 = StructStats::GetChildStats(pvVar1);
  for (i_00 = 0; iVar2 != i_00; i_00 = i_00 + 1) {
    StructStats::SetChildStats(&new_stats,i_00,new_stats_00);
    new_stats_00 = new_stats_00 + 1;
  }
  iVar2 = StructType::GetChildCount(other);
  pBVar5 = (this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
           super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>).
           super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pBVar4 - (long)pBVar5;
  for (__n = 1; __n < (ulong)(((long)pBVar4 - (long)pBVar5) / 0x58); __n = __n + 1) {
    pvVar1 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,__n);
    StructStats::SetChildStats(&new_stats,lVar3 / -0x58 + iVar2 + __n,pvVar1);
    pBVar5 = (this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
             ).super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar4 = (this_00->super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
             ).super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&new_stats);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StructInsertStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto new_stats = StructStats::CreateUnknown(expr.return_type);

	auto existing_count = StructType::GetChildCount(child_stats[0].GetType());
	auto existing_stats = StructStats::GetChildStats(child_stats[0]);
	for (idx_t i = 0; i < existing_count; i++) {
		StructStats::SetChildStats(new_stats, i, existing_stats[i]);
	}

	auto new_count = StructType::GetChildCount(expr.return_type);
	auto offset = new_count - child_stats.size();
	for (idx_t i = 1; i < child_stats.size(); i++) {
		StructStats::SetChildStats(new_stats, offset + i, child_stats[i]);
	}
	return new_stats.ToUnique();
}